

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

void benchmark<unsigned_short>(tasks_t tasks,size_t max,size_t iters)

{
  ostream *poVar1;
  unsigned_short max_00;
  ulong uVar2;
  ulong uVar3;
  size_t iters_00;
  result_t rVar4;
  double local_60;
  double local_58;
  double local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dividers;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----- ");
  poVar1 = std::operator<<(poVar1,"u16");
  poVar1 = std::operator<<(poVar1," -----");
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar2 = 0xffff;
  if (max < 0xffff) {
    uVar2 = max;
  }
  max_00 = (unsigned_short)uVar2;
  rVar4 = (result_t)ZEXT816(0);
  iters_00 = (max / uVar2) * iters;
  if ((tasks & 0x40) != 0) {
    get_primes<unsigned_short,unsigned_short>(&dividers,max_00);
    rVar4 = benchmark_sum_dividers<unsigned_short,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                      (&dividers,iters_00);
    std::operator<<((ostream *)&std::cout,'.');
    std::ostream::flush();
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&dividers.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  uVar2 = rVar4.sum;
  local_50 = rVar4.duration;
  if ((tasks >> 8 & 1) == 0) {
    rVar4 = (result_t)ZEXT816(0);
  }
  else {
    get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)0>,unsigned_short>
              ((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                *)&dividers,max_00);
    rVar4 = benchmark_sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>>
                      ((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                        *)&dividers,iters_00);
    std::operator<<((ostream *)&std::cout,'.');
    std::ostream::flush();
    std::
    _Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
    ::~_Vector_base((_Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                     *)&dividers);
  }
  uVar3 = rVar4.sum;
  local_58 = rVar4.duration;
  if ((char)tasks < '\0') {
    get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)1>,unsigned_short>
              ((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
                *)&dividers,max_00);
    rVar4 = benchmark_sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)1>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)1>>>>
                      ((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
                        *)&dividers,iters_00);
    poVar1 = std::operator<<((ostream *)&std::cout,'.');
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    _Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
    ::~_Vector_base((_Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
                     *)&dividers);
  }
  else {
    rVar4 = (result_t)ZEXT816(0);
  }
  local_60 = rVar4.duration;
  if (((~tasks & 0x140) == 0) && (uVar3 != uVar2)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: branchfull_divider<");
    poVar1 = std::operator<<(poVar1,"u16");
    poVar1 = std::operator<<(poVar1,"> sum: ");
  }
  else {
    if (((~tasks & 0xc0) != 0) || (rVar4.sum == uVar2)) {
      if ((tasks & 0x40) != 0) {
        std::operator<<((ostream *)&std::cout,"    system: ");
        poVar1 = std::ostream::_M_insert<double>(local_50);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      if ((tasks >> 8 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"branchfull: ");
        poVar1 = std::ostream::_M_insert<double>(local_58);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      if ((char)tasks < '\0') {
        std::operator<<((ostream *)&std::cout,"branchfree: ");
        poVar1 = std::ostream::_M_insert<double>(local_60);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: branchfree_divider<");
    poVar1 = std::operator<<(poVar1,"u16");
    poVar1 = std::operator<<(poVar1,"> sum: ");
    uVar3 = rVar4.sum;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  poVar1 = std::operator<<(poVar1,", but system sum: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void benchmark(tasks_t tasks, size_t max, size_t iters) {
    std::cout << "----- " << type_tag<T>::get_tag() << " -----" << std::endl;

    bool test_system = !!(tasks & TEST_SYSTEM);
    bool test_branchfull = !!(tasks & TEST_BRANCHFULL);
    bool test_branchfree = !!(tasks & TEST_BRANCHFREE);

    result_t sys = {0, 0};
    result_t branchfull = {0, 0};
    result_t branchfree = {0, 0};

    size_t st_max = std::min(max, (size_t)std::numeric_limits<T>::max());
    iters = iters * (max / st_max);
    T t_max = (T)st_max;
    if (test_system) {
        using divider_type = T;
        auto dividers = get_primes<divider_type>(t_max);
        sys = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfull) {
        using divider_type = libdivide::divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfull = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfree) {
        using divider_type = libdivide::branchfree_divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfree = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::endl;
    }

    if (test_system && test_branchfull && branchfull.sum != sys.sum) {
        std::cerr << "Error: branchfull_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfull.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system && test_branchfree && branchfree.sum != sys.sum) {
        std::cerr << "Error: branchfree_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfree.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system) std::cout << "    system: " << sys.duration << " seconds" << std::endl;
    if (test_branchfull)
        std::cout << "branchfull: " << branchfull.duration << " seconds" << std::endl;
    if (test_branchfree)
        std::cout << "branchfree: " << branchfree.duration << " seconds" << std::endl;

    std::cout << std::endl;
}